

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O3

void Sym_ManStop(Sym_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  Vec_Vec_t *__ptr;
  void *__ptr_00;
  Vec_Int_t *pVVar2;
  int *piVar3;
  void **ppvVar4;
  int iVar5;
  long lVar6;
  
  Sym_ManPrintStats(p);
  if (p->vSuppFun != (Vec_Ptr_t *)0x0) {
    Sim_UtilInfoFree(p->vSuppFun);
  }
  if (p->vSim != (Vec_Ptr_t *)0x0) {
    Sim_UtilInfoFree(p->vSim);
  }
  pVVar1 = p->vNodes;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  __ptr = p->vSupports;
  if (__ptr != (Vec_Vec_t *)0x0) {
    iVar5 = __ptr->nSize;
    if (0 < iVar5) {
      lVar6 = 0;
      do {
        __ptr_00 = __ptr->pArray[lVar6];
        if (__ptr_00 != (void *)0x0) {
          if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr_00 + 8));
          }
          free(__ptr_00);
          iVar5 = __ptr->nSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar5);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
  if (0 < p->nOutputs) {
    lVar6 = 0;
    do {
      Extra_BitMatrixStop((Extra_BitMat_t *)p->vMatrSymms->pArray[lVar6]);
      Extra_BitMatrixStop((Extra_BitMat_t *)p->vMatrNonSymms->pArray[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->nOutputs);
  }
  pVVar2 = p->vVarsU;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vVarsV;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar1 = p->vMatrSymms;
  ppvVar4 = pVVar1->pArray;
  if (ppvVar4 != (void **)0x0) {
    free(ppvVar4);
  }
  free(pVVar1);
  pVVar1 = p->vMatrNonSymms;
  ppvVar4 = pVVar1->pArray;
  if (ppvVar4 != (void **)0x0) {
    free(ppvVar4);
  }
  free(pVVar1);
  pVVar2 = p->vPairsTotal;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vPairsSym;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vPairsNonSym;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  if (p->uPatRand != (uint *)0x0) {
    free(p->uPatRand);
    p->uPatRand = (uint *)0x0;
  }
  if (p->uPatCol != (uint *)0x0) {
    free(p->uPatCol);
    p->uPatCol = (uint *)0x0;
  }
  if (p->uPatRow != (uint *)0x0) {
    free(p->uPatRow);
  }
  free(p);
  return;
}

Assistant:

void Sym_ManStop( Sym_Man_t * p )
{
    int i;
    Sym_ManPrintStats( p );
    if ( p->vSuppFun )     Sim_UtilInfoFree( p->vSuppFun );   
    if ( p->vSim )         Sim_UtilInfoFree( p->vSim );   
    if ( p->vNodes )       Vec_PtrFree( p->vNodes );
    if ( p->vSupports )    Vec_VecFree( p->vSupports );
    for ( i = 0; i < p->nOutputs; i++ )
    {
        Extra_BitMatrixStop( (Extra_BitMat_t *)p->vMatrSymms->pArray[i] );
        Extra_BitMatrixStop( (Extra_BitMat_t *)p->vMatrNonSymms->pArray[i] );
    }
    Vec_IntFree( p->vVarsU );
    Vec_IntFree( p->vVarsV );
    Vec_PtrFree( p->vMatrSymms );
    Vec_PtrFree( p->vMatrNonSymms );
    Vec_IntFree( p->vPairsTotal );
    Vec_IntFree( p->vPairsSym );
    Vec_IntFree( p->vPairsNonSym );
    ABC_FREE( p->uPatRand );
    ABC_FREE( p->uPatCol );
    ABC_FREE( p->uPatRow );
    ABC_FREE( p );
}